

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O2

void __thiscall despot::log_ostream::log_buf::~log_buf(log_buf *this)

{
  ~log_buf(this);
  operator_delete(this,0x90);
  return;
}

Assistant:

log_ostream::log_buf::~log_buf() {
	// pubsync();
}